

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall
pbrt::FormattingScene::MakeNamedMaterial
          (FormattingScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  FileLoc loc_00;
  iterator iVar4;
  mapped_type *pmVar5;
  undefined8 *puVar6;
  long *plVar7;
  ostream *poVar8;
  mapped_type *this_01;
  size_type *psVar9;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  ulong uVar10;
  ParameterDictionary dict;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  ulong *local_120;
  long local_118;
  ulong local_110 [2];
  string *local_100;
  ParameterDictionary local_f8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_90;
  
  local_1c0._M_dataplus._M_p = (pointer)pstd::pmr::new_delete_resource();
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_90,in_RDX,(polymorphic_allocator<pbrt::ParsedParameter_*> *)&local_1c0);
  ParameterDictionary::ParameterDictionary(&local_f8,&local_90,RGBColorSpace::sRGB);
  local_90.nStored = 0;
  (*(local_90.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_90.alloc.memoryResource,local_90.ptr,local_90.nAlloc << 3,8);
  if (this->upgrade == true) {
    ParameterDictionary::RenameUsedTextures(&local_f8,&this->definedTextures);
    this_00 = &this->definedNamedMaterials;
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)this_00,name);
    if (iVar4._M_node == (_Base_ptr)&this->field_0x50) {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,name);
      std::__cxx11::string::_M_assign((string *)pmVar5);
    }
    else {
      paVar1 = &local_1c0.field_2;
      local_1c0._M_string_length = 0;
      local_1c0.field_2._M_local_buf[0] = '\0';
      local_1c0._M_dataplus._M_p = (pointer)paVar1;
      detail::stringPrintfRecursive<std::__cxx11::string_const&>
                (&local_1c0,"%s: renaming multiply-defined named material",name);
      Warning((FileLoc *)&params,local_1c0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1c0._M_dataplus._M_p,
                        CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                                 local_1c0.field_2._M_local_buf[0]) + 1);
      }
      local_160._M_dataplus._M_p._0_4_ = MakeNamedMaterial::count;
      local_1c0._M_string_length = 0;
      local_1c0.field_2._M_local_buf[0] = '\0';
      MakeNamedMaterial::count = MakeNamedMaterial::count + 1;
      local_1c0._M_dataplus._M_p = (pointer)paVar1;
      detail::stringPrintfRecursive<std::__cxx11::string_const&,int>
                (&local_1c0,"%s-renamed-%d",name,(int *)&local_160);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,name);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1c0._M_dataplus._M_p,
                        CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                                 local_1c0.field_2._M_local_buf[0]) + 1);
      }
    }
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_1c0,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,name);
    Printf<std::__cxx11::string,std::__cxx11::string&>
              ("%sMakeNamedMaterial \"%s\"\n",&local_1c0,pmVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
LAB_003758a9:
      operator_delete(local_1c0._M_dataplus._M_p,
                      CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                               local_1c0.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_1c0,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
    Printf<std::__cxx11::string,std::__cxx11::string_const&>
              ("%sMakeNamedMaterial \"%s\"\n",&local_1c0,name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) goto LAB_003758a9;
  }
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  local_1c0._M_string_length = 0;
  local_1c0.field_2._M_local_buf[0] = '\0';
  if (this->upgrade != true) goto LAB_00375c85;
  paVar1 = &local_1a0.field_2;
  local_1a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"type","");
  paVar2 = &local_180.field_2;
  local_180._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"");
  ParameterDictionary::GetOneString(&local_160,&local_f8,&local_1a0,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  loc_00.filename._M_str = (char *)params.ptr;
  loc_00.filename._M_len = (size_t)params.alloc.memoryResource;
  loc_00._16_8_ = params.field_2.fixed[0];
  upgradeMaterial(&local_1a0,this,&local_160,&local_f8,loc_00);
  std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  local_1a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"type","");
  ParameterDictionary::RemoveString(&local_f8,&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  local_120 = local_110;
  std::__cxx11::string::_M_construct
            ((ulong)&local_120,
             (char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc + '\x04');
  paVar3 = &local_140.field_2;
  local_140._M_string_length = 0;
  local_140.field_2._M_local_buf[0] = '\0';
  local_140._M_dataplus._M_p = (pointer)paVar3;
  detail::stringPrintfRecursive<std::__cxx11::string&>
            (&local_140,"\"string type\" [ \"%s\" ]\n",&local_160);
  uVar10 = 0xf;
  if (local_120 != local_110) {
    uVar10 = local_110[0];
  }
  local_100 = name;
  if (uVar10 < local_140._M_string_length + local_118) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar3) {
      uVar10 = CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                        local_140.field_2._M_local_buf[0]);
    }
    if (uVar10 < local_140._M_string_length + local_118) goto LAB_00375aa9;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,(ulong)local_120);
  }
  else {
LAB_00375aa9:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_140._M_dataplus._M_p);
  }
  psVar9 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_180.field_2._M_allocated_capacity = *psVar9;
    local_180.field_2._8_8_ = puVar6[3];
    local_180._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_180.field_2._M_allocated_capacity = *psVar9;
    local_180._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_180._M_string_length = puVar6[1];
  *puVar6 = psVar9;
  puVar6[1] = 0;
  *(undefined1 *)psVar9 = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_180,(ulong)local_1c0._M_dataplus._M_p);
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_1a0.field_2._M_allocated_capacity = *psVar9;
    local_1a0.field_2._8_8_ = plVar7[3];
    local_1a0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1a0.field_2._M_allocated_capacity = *psVar9;
    local_1a0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_1a0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar3) {
    operator_delete(local_140._M_dataplus._M_p,
                    CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                             local_140.field_2._M_local_buf[0]) + 1);
  }
  name = local_100;
  if (local_120 != local_110) {
    operator_delete(local_120,local_110[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_160._M_dataplus._M_p._4_4_,(int)local_160._M_dataplus._M_p) !=
      &local_160.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_160._M_dataplus._M_p._4_4_,(int)local_160._M_dataplus._M_p),
                    local_160.field_2._M_allocated_capacity + 1);
  }
LAB_00375c85:
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  ParameterDictionary::ToParameterList_abi_cxx11_
            (&local_160,&local_f8,*(int *)&(this->super_SceneRepresentation).field_0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,(char *)CONCAT44(local_160._M_dataplus._M_p._4_4_,
                                     (int)local_160._M_dataplus._M_p),local_160._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_160._M_dataplus._M_p._4_4_,(int)local_160._M_dataplus._M_p) !=
      &local_160.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_160._M_dataplus._M_p._4_4_,(int)local_160._M_dataplus._M_p),
                    local_160.field_2._M_allocated_capacity + 1);
  }
  if (this->upgrade == true) {
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->definedNamedMaterials,name);
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::ParameterDictionary,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::ParameterDictionary>_>_>
              ::operator[](&this->namedMaterialDictionaries,pmVar5);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::operator=(&this_01->params,&local_f8.params);
    this_01->colorSpace = local_f8.colorSpace;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,
                    CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                             local_1c0.field_2._M_local_buf[0]) + 1);
  }
  local_f8.params.nStored = 0;
  (*(local_f8.params.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_f8.params.alloc.memoryResource,local_f8.params.ptr,local_f8.params.nAlloc << 3,8)
  ;
  return;
}

Assistant:

void FormattingScene::MakeNamedMaterial(const std::string &name,
                                        ParsedParameterVector params, FileLoc loc) {
    ParameterDictionary dict(params, RGBColorSpace::sRGB);

    if (upgrade) {
        dict.RenameUsedTextures(definedTextures);

        if (definedNamedMaterials.find(name) != definedNamedMaterials.end()) {
            static int count = 0;
            Warning(&loc, "%s: renaming multiply-defined named material", name);
            definedNamedMaterials[name] = StringPrintf("%s-renamed-%d", name, count++);
        } else
            definedNamedMaterials[name] = name;
        Printf("%sMakeNamedMaterial \"%s\"\n", indent(), definedNamedMaterials[name]);
    } else
        Printf("%sMakeNamedMaterial \"%s\"\n", indent(), name);

    std::string extra;
    if (upgrade) {
        std::string matName = dict.GetOneString("type", "");
        extra = upgradeMaterial(&matName, &dict, loc);
        dict.RemoveString("type");
        extra = indent(1) + StringPrintf("\"string type\" [ \"%s\" ]\n", matName) + extra;
    }
    std::cout << extra << dict.ToParameterList(catIndentCount);

    if (upgrade)
        namedMaterialDictionaries[definedNamedMaterials[name]] = std::move(dict);
}